

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

void update_monsters(_Bool full)

{
  wchar_t wVar1;
  monster *mon_00;
  monster *mon;
  wchar_t i;
  _Bool full_local;
  
  mon._0_4_ = L'\x01';
  while( true ) {
    wVar1 = cave_monster_max(cave);
    if (wVar1 <= (wchar_t)mon) break;
    mon_00 = (monster *)cave_monster(cave,(wchar_t)mon);
    if (mon_00->race != (monster_race *)0x0) {
      update_mon(mon_00,(chunk *)cave,full);
    }
    mon._0_4_ = (wchar_t)mon + L'\x01';
  }
  return;
}

Assistant:

void update_monsters(bool full)
{
	int i;

	/* Update each (live) monster */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Update the monster if alive */
		if (mon->race)
			update_mon(mon, cave, full);
	}
}